

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_npn_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  uint16_t uVar1;
  int iVar2;
  bool bVar3;
  
  ssl = hs->ssl;
  uVar1 = ssl_protocol_version(ssl);
  bVar3 = true;
  if ((contents != (CBS *)0x0) && (uVar1 < 0x304)) {
    if (contents->len == 0) {
      if (((contents != (CBS *)0x0) && ((ssl->s3->field_0xdc & 0x10) == 0)) &&
         (((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->next_protos_advertised_cb !=
          (_func_int_SSL_ptr_uint8_t_ptr_ptr_uint_ptr_void_ptr *)0x0)) {
        iVar2 = SSL_is_dtls(ssl);
        if (iVar2 == 0) {
          hs->field_0x6c9 = hs->field_0x6c9 | 0x80;
        }
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool ext_npn_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (contents != NULL && CBS_len(contents) != 0) {
    return false;
  }

  if (contents == NULL ||                             //
      ssl->s3->initial_handshake_complete ||          //
      ssl->ctx->next_protos_advertised_cb == NULL ||  //
      SSL_is_dtls(ssl)) {
    return true;
  }

  hs->next_proto_neg_seen = true;
  return true;
}